

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall GlobOpt::CopyPropDstUses(GlobOpt *this,Opnd *opnd,Instr *instr,Value *src1Val)

{
  bool bVar1;
  SymOpnd *this_00;
  PropertySym *pPVar2;
  GlobOptBlockData *this_01;
  Value *this_02;
  ValueInfo *this_03;
  anon_union_2_4_ea848c7b_for_ValueType_13 *local_60;
  Value *objectValue;
  PropertySym *originalPropertySym;
  SymOpnd *symOpnd;
  Value *src1Val_local;
  Instr *instr_local;
  Opnd *opnd_local;
  GlobOpt *this_local;
  
  bVar1 = IR::Opnd::IsSymOpnd(opnd);
  if (bVar1) {
    this_00 = IR::Opnd::AsSymOpnd(opnd);
    bVar1 = Sym::IsPropertySym(this_00->m_sym);
    if (bVar1) {
      pPVar2 = Sym::AsPropertySym(this_00->m_sym);
      this_01 = CurrentBlockData(this);
      this_02 = GlobOptBlockData::FindValue(this_01,&pPVar2->m_stackSym->super_Sym);
      if (this_02 == (Value *)0x0) {
        local_60 = &ValueType::Uninitialized.field_0;
      }
      else {
        this_03 = ::Value::GetValueInfo(this_02);
        local_60 = &ValueInfo::Type(this_03)->field_0;
      }
      IR::SymOpnd::SetPropertyOwnerValueType
                (this_00,(ValueType)*(anon_union_2_4_ea848c7b_for_ValueType_13 *)&local_60->field_0)
      ;
      CopyPropPropertySymObj(this,this_00,instr);
    }
  }
  return;
}

Assistant:

void
GlobOpt::CopyPropDstUses(IR::Opnd *opnd, IR::Instr *instr, Value *src1Val)
{
    if (opnd->IsSymOpnd())
    {
        IR::SymOpnd *symOpnd = opnd->AsSymOpnd();

        if (symOpnd->m_sym->IsPropertySym())
        {
            PropertySym * originalPropertySym = symOpnd->m_sym->AsPropertySym();

            Value *const objectValue = CurrentBlockData()->FindValue(originalPropertySym->m_stackSym);
            symOpnd->SetPropertyOwnerValueType(objectValue ? objectValue->GetValueInfo()->Type() : ValueType::Uninitialized);

            this->CopyPropPropertySymObj(symOpnd, instr);
        }
    }
}